

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O0

void duckdb::FormatBytesFunction<1024l>(DataChunk *args,ExpressionState *state,Vector *result)

{
  reference result_00;
  anon_class_8_1_6971b95b in_RDX;
  DataChunk *in_RDI;
  idx_t in_stack_ffffffffffffffc8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffd0;
  anon_class_8_1_6971b95b input;
  
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  input.result = in_RDX.result;
  DataChunk::size(in_RDI);
  UnaryExecutor::
  Execute<long,duckdb::string_t,duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_>
            (input.result,result_00,in_stack_ffffffffffffffc8,in_RDX,CANNOT_ERROR);
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}